

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ConfigUseClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConfigUseClauseSyntax,slang::parsing::Token,slang::syntax::ConfigCellIdentifierSyntax*,slang::syntax::ParameterValueAssignmentSyntax*,slang::parsing::Token,slang::parsing::Token>
          (BumpAllocator *this,Token *args,ConfigCellIdentifierSyntax **args_1,
          ParameterValueAssignmentSyntax **args_2,Token *args_3,Token *args_4)

{
  Token use;
  Token config;
  ConfigUseClauseSyntax *name;
  Token *in_RSI;
  Info *in_R8;
  undefined8 *in_R9;
  size_t in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  BumpAllocator *in_stack_ffffffffffffff98;
  
  name = (ConfigUseClauseSyntax *)
         allocate(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  use.info = (Info *)in_R8->rawTextPtr;
  use._0_8_ = (ParameterValueAssignmentSyntax *)in_R9[1];
  config.info = in_R8;
  config._0_8_ = in_R9;
  slang::syntax::ConfigUseClauseSyntax::ConfigUseClauseSyntax
            ((ConfigUseClauseSyntax *)*in_R9,use,(ConfigCellIdentifierSyntax *)name,
             (ParameterValueAssignmentSyntax *)in_R9[1],*in_RSI,config);
  return name;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }